

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

mkv_timestamp_t MATROSKA_CueTimestamp(matroska_cuepoint *Cue)

{
  ebml_context *peVar1;
  bool_t bVar2;
  ebml_integer *Element;
  int64_t iVar3;
  mkv_timestamp_t mVar4;
  
  peVar1 = MATROSKA_getContextCuePoint();
  bVar2 = EBML_ElementIsType((ebml_element *)Cue,peVar1);
  if (bVar2 != 0) {
    peVar1 = MATROSKA_getContextCueTime();
    Element = (ebml_integer *)EBML_MasterFindFirstElt(&Cue->Base,peVar1,0,0,0);
    if (Element == (ebml_integer *)0x0) {
      mVar4 = 0x7fffffffffffffff;
    }
    else {
      iVar3 = EBML_IntegerValue(Element);
      mVar4 = MATROSKA_SegmentInfoTimestampScale(Cue->SegInfo);
      mVar4 = mVar4 * iVar3;
    }
    return mVar4;
  }
  __assert_fail("EBML_ElementIsType((ebml_element*)Cue, MATROSKA_getContextCuePoint())",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x31e,"mkv_timestamp_t MATROSKA_CueTimestamp(const matroska_cuepoint *)");
}

Assistant:

mkv_timestamp_t MATROSKA_CueTimestamp(const matroska_cuepoint *Cue)
{
    ebml_integer *Timestamp;
    assert(EBML_ElementIsType((ebml_element*)Cue, MATROSKA_getContextCuePoint()));
    Timestamp = (ebml_integer*) EBML_MasterFindChild((ebml_master*)Cue,MATROSKA_getContextCueTime());
    if (!Timestamp)
        return INVALID_TIMESTAMP_T;
    return EBML_IntegerValue(Timestamp) * MATROSKA_SegmentInfoTimestampScale(Cue->SegInfo);
}